

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

void __thiscall MuHash3072::MuHash3072(MuHash3072 *this,Span<const_unsigned_char> in)

{
  MuHash3072 *this_00;
  long in_FS_OFFSET;
  Num3072 local_1a0;
  long local_20;
  
  this_00 = (MuHash3072 *)in.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  Num3072::SetToOne(&this->m_numerator);
  Num3072::SetToOne(&this->m_denominator);
  ToNum3072(&local_1a0,this_00,in);
  memcpy(this,&local_1a0,0x180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

MuHash3072::MuHash3072(Span<const unsigned char> in) noexcept
{
    m_numerator = ToNum3072(in);
}